

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void tchecker::clockbounds::fill_global_m_map(global_m_map_t *global_m_map,local_lu_map_t *param_2)

{
  uint uVar1;
  map_t *pmVar2;
  undefined1 auVar3 [16];
  invalid_argument *this;
  ulong uVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar9;
  
  auVar3 = _DAT_001f79d0;
  if (global_m_map->_clock_nb != param_2->_clock_nb) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"*** fill_gloal_m_map: incompatible clock number");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pmVar2 = global_m_map->_M;
  uVar5 = (ulong)(pmVar2->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar5 != 0) {
    lVar9 = uVar5 - 1;
    auVar6._8_4_ = (int)lVar9;
    auVar6._0_8_ = lVar9;
    auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_001f79d0;
    auVar8 = _DAT_001f79b0;
    auVar10 = _DAT_001f79c0;
    do {
      auVar11 = auVar10 ^ auVar3;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar7 && auVar6._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_)
                & 1)) {
        *(undefined4 *)(&(pmVar2->_fam).field_0x0 + uVar4) = 0xc0000001;
      }
      if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
          auVar11._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)&pmVar2[1].super_array_capacity_t<unsigned_int>._capacity + uVar4) =
             0xc0000001;
      }
      auVar11 = auVar8 ^ auVar3;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar7 && (iVar12 != iVar7 || auVar11._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)(&pmVar2[1]._fam.field_0x0 + uVar4) = 0xc0000001;
        *(undefined4 *)((long)&pmVar2[2].super_array_capacity_t<unsigned_int>._capacity + uVar4) =
             0xc0000001;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      uVar4 = uVar4 + 0x10;
    } while ((uVar5 * 4 + 0xc & 0xfffffffffffffff0) != uVar4);
  }
  uVar1 = param_2->_loc_nb;
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    do {
      if (param_2->_loc_nb <= uVar5) {
        __assert_fail("id < _loc_nb",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                      ,0xc0,
                      "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::L(tchecker::loc_id_t) const"
                     );
      }
      update(global_m_map->_M,
             (param_2->_L).
             super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      if (param_2->_loc_nb <= uVar5) {
        __assert_fail("id < _loc_nb",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                      ,0xcc,
                      "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::U(tchecker::loc_id_t) const"
                     );
      }
      update(global_m_map->_M,
             (param_2->_U).
             super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

tchecker::clockbounds::map_t & global_m_map_t::M(void) { return *_M; }